

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O2

void __thiscall
booster::locale::boundary::details::
segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
::set(segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      *this,base_iterator p)

{
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *p_Var1;
  element_type *peVar2;
  break_info *pbVar3;
  break_info *pbVar4;
  bool bVar5;
  __normal_iterator<const_booster::locale::boundary::break_info_*,_std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
  _Var6;
  wchar_t *pwVar7;
  size_t sVar8;
  size_t sVar9;
  break_info *pbVar10;
  
  peVar2 = (this->map_->index_).
           super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  pbVar3 = (peVar2->
           super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (peVar2->
           super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  _Var6 = std::
          __upper_bound<__gnu_cxx::__normal_iterator<booster::locale::boundary::break_info_const*,std::vector<booster::locale::boundary::break_info,std::allocator<booster::locale::boundary::break_info>>>,booster::locale::boundary::break_info,__gnu_cxx::__ops::_Val_less_iter>
                    (pbVar3,pbVar4);
  for (; (pbVar10 = pbVar4, _Var6._M_current != pbVar4 &&
         (pbVar10 = _Var6._M_current, ((_Var6._M_current)->rule & this->mask_) == 0));
      _Var6._M_current = _Var6._M_current + 1) {
  }
  sVar9 = (long)pbVar10 - (long)pbVar3 >> 4;
  (this->current_).second = sVar9;
  (this->current_).first = sVar9;
  if (this->full_select_ == true) {
    do {
      if (sVar9 == 0) {
        sVar9 = 0;
        break;
      }
      (this->current_).first = sVar9 - 1;
      bVar5 = valid_offset(this,sVar9 - 1);
      sVar9 = (this->current_).first;
    } while (!bVar5);
  }
  else if (pbVar10 != pbVar3) {
    sVar9 = sVar9 - 1;
    (this->current_).first = sVar9;
  }
  (this->value_).
  super_pair<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  .first._M_current = (this->map_->begin_)._M_current;
  sVar9 = get_offset(this,sVar9);
  pwVar7 = (this->value_).
           super_pair<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           .first._M_current + sVar9;
  (this->value_).
  super_pair<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  .first._M_current = pwVar7;
  (this->value_).
  super_pair<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  .second._M_current = pwVar7;
  sVar9 = get_offset(this,(this->current_).second);
  sVar8 = get_offset(this,(this->current_).first);
  p_Var1 = &(this->value_).
            super_pair<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            .second;
  p_Var1->_M_current = p_Var1->_M_current + (sVar9 - sVar8);
  update_rule(this);
  return;
}

Assistant:

void set(base_iterator p)
                    {
                        size_t dist=std::distance(map_->begin(),p);
                        index_type::const_iterator b=map_->index().begin(),e=map_->index().end();
                        index_type::const_iterator 
                            boundary_point=std::upper_bound(b,e,break_info(dist));
                        while(boundary_point != e && (boundary_point->rule & mask_)==0)
                            boundary_point++;

                        current_.first = current_.second = boundary_point - b;
                        
                        if(full_select_) {
                            while(current_.first > 0) {
                                current_.first --;
                                if(valid_offset(current_.first))
                                    break;
                            }
                        }
                        else {
                            if(current_.first > 0)
                                current_.first --;
                        }
                        value_.first = map_->begin();
                        std::advance(value_.first,get_offset(current_.first));
                        value_.second = value_.first;
                        std::advance(value_.second,get_offset(current_.second) - get_offset(current_.first));

                        update_rule();
                    }